

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char,kj::String,char>
          (StringTree *__return_storage_ptr__,kj *this,char *params,String *params_1,char *params_2)

{
  char *pcVar1;
  String *str;
  char local_69 [1];
  StringTree local_68;
  char local_29 [1];
  String *local_28;
  char *params_local_2;
  String *params_local_1;
  char *params_local;
  
  local_28 = params_1;
  params_local_2 = params;
  params_local_1 = (String *)this;
  params_local = (char *)__return_storage_ptr__;
  pcVar1 = fwd<char>((NoInfer<char> *)this);
  local_29[0] = (char)_::toStringTreeOrCharSequence<char>(pcVar1);
  str = fwd<kj::String>((NoInfer<kj::String> *)params_local_2);
  _::toStringTreeOrCharSequence(&local_68,str);
  pcVar1 = fwd<char>((NoInfer<char> *)local_28);
  local_69[0] = (char)_::toStringTreeOrCharSequence<char>(pcVar1);
  StringTree::concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)local_29,(FixedArray<char,_1UL> *)&local_68,
             (StringTree *)local_69,(FixedArray<char,_1UL> *)params_2);
  StringTree::~StringTree(&local_68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}